

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cmd.h
# Opt level: O0

void __thiscall Cmd::Cmd(Cmd *this,string *history_file,FILE *in,FILE *out)

{
  int iVar1;
  allocator<char> local_29;
  FILE *local_28;
  FILE *out_local;
  FILE *in_local;
  string *history_file_local;
  Cmd *this_local;
  
  local_28 = out;
  out_local = in;
  in_local = (FILE *)history_file;
  history_file_local = &this->prompt;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)this,"(Cmd) ",&local_29);
  std::allocator<char>::~allocator(&local_29);
  this->multiline_mode = false;
  this->raw_mode_ = false;
  this->in_ = out_local;
  this->out_ = local_28;
  this->complete_key_ = 9;
  this->in_fd_ = 0;
  this->out_fd_ = 1;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_(Cmd_*,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_(Cmd_*,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>_>_>_>
  ::map(&this->commands_);
  std::function<std::optional<Cmd::Hint>_(std::basic_string_view<char,_std::char_traits<char>_>)>::
  function(&this->hints_handler_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->history_);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
            (&this->history_file_,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_local);
  iVar1 = fileno((FILE *)this->in_);
  this->in_fd_ = iVar1;
  iVar1 = fileno((FILE *)this->out_);
  this->out_fd_ = iVar1;
  loadHistory(this);
  return;
}

Assistant:

explicit Cmd(const std::string &history_file, FILE *in = stdin, FILE *out = stdout)
		: in_(in), out_(out), history_file_(history_file) {

		in_fd_  = fileno(in_);
		out_fd_ = fileno(out_);

		loadHistory();
	}